

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall
TextState<true>::String
          (TextState<true> *this,Context<true> *ctx,char *str,SizeType length,bool copy)

{
  char *pcVar1;
  byte bVar2;
  char *str_00;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  Namespace<true> *this_00;
  
  this_00 = (ctx->namespace_path).
            super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  uVar4 = (ulong)length;
  pcVar1 = str + uVar4;
  if (length != 0) {
    pcVar5 = str + 1;
    str_00 = str;
    pcVar3 = str;
    do {
      bVar2 = pcVar5[-1];
      str = str_00;
      if (bVar2 < 0x3a) {
        if (((bVar2 == 9) || (bVar2 == 0x20)) &&
           (pcVar5[-1] = '\0', str = pcVar5, pcVar3 != str_00 && -1 < (long)pcVar3 - (long)str_00))
        {
          Namespace<true>::AddFeature(this_00,ctx->all,str_00);
        }
      }
      else if ((bVar2 == 0x3a) || (bVar2 == 0x7c)) {
        pcVar5[-1] = '_';
      }
      pcVar5 = pcVar5 + 1;
      pcVar3 = pcVar3 + 1;
      uVar4 = uVar4 - 1;
      str_00 = str;
    } while (uVar4 != 0);
  }
  if (str < pcVar1) {
    Namespace<true>::AddFeature(this_00,ctx->all,str);
  }
  return ctx->previous_state;
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool copy)
  {
    // only to be used with copy=false
    assert(!copy);

    auto& ns = ctx.CurrentNamespace();

    // split into individual features
    const char* start = str;
    const char* end = str + length;
    for (char* p = (char*)str; p != end; p++)
    {
      switch (*p)
      {
          // split on space and tab
        case ' ':
        case '\t':
          *p = '\0';
          if (p - start > 0)
            ns.AddFeature(ctx.all, start);

          start = p + 1;
          break;
          // escape chars
        case ':':
        case '|':
          *p = '_';
          break;
      }
    }

    if (start < end)
      ns.AddFeature(ctx.all, start);

    return ctx.previous_state;
  }